

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::ValueIteratorBase::key(ValueIteratorBase *this)

{
  bool bVar1;
  reference __s;
  char *pcVar2;
  int __c;
  Value *in_RDI;
  CZString czstring;
  StaticString *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  UInt in_stack_ffffffffffffff84;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  Value *this_00;
  StaticString local_38 [3];
  CZString local_20 [2];
  
  this_00 = in_RDI;
  __s = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                  ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                   0x12af6b);
  Value::CZString::CZString
            ((CZString *)this_00,
             (CZString *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  pcVar2 = Value::CZString::c_str(local_20);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = Value::CZString::index(local_20,(char *)__s,__c);
    in_stack_ffffffffffffff84 = (UInt)pcVar2;
    Value::Value(this_00,in_stack_ffffffffffffff84);
  }
  else {
    bVar1 = Value::CZString::isStaticString(local_20);
    if (bVar1) {
      pcVar2 = Value::CZString::c_str(local_20);
      StaticString::StaticString(local_38,pcVar2);
      Value::Value((Value *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
    }
    else {
      Value::CZString::c_str(local_20);
      Value::Value((Value *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (char *)in_stack_ffffffffffffff78);
    }
  }
  Value::CZString::~CZString
            ((CZString *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return in_RDI;
}

Assistant:

Value ValueIteratorBase::key() const {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  const Value::CZString czstring = (*current_).first;
  if (czstring.c_str()) {
    if (czstring.isStaticString())
      return Value(StaticString(czstring.c_str()));
    return Value(czstring.c_str());
  }
  return Value(czstring.index());
#else
  if (isArray_)
    return Value(ValueInternalArray::indexOf(iterator_.array_));
  bool isStatic;
  const char* memberName = ValueInternalMap::key(iterator_.map_, isStatic);
  if (isStatic)
    return Value(StaticString(memberName));
  return Value(memberName);
#endif
}